

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f77_wrap3.c
# Opt level: O0

void Cffgknl(fitsfile *fptr,char *keyroot,int nstart,int nkeys,int *numval,int *nfound,int *status)

{
  int local_34;
  int i;
  int *nfound_local;
  int *numval_local;
  int nkeys_local;
  int nstart_local;
  char *keyroot_local;
  fitsfile *fptr_local;
  
  for (local_34 = 0; local_34 < nkeys; local_34 = local_34 + 1) {
    numval[local_34] = numval[local_34];
  }
  ffgknl(fptr,keyroot,nstart,nkeys,numval,nfound,status);
  for (local_34 = 0; local_34 < nkeys; local_34 = local_34 + 1) {
    numval[local_34] = (uint)(numval[local_34] != 0);
  }
  return;
}

Assistant:

void Cffgknl( fitsfile *fptr, char *keyroot, int nstart, int nkeys,
              int *numval, int *nfound, int *status )
{
   int i;
 
   for( i=0; i<nkeys; i++ )  /*  This preserves array elements across call  */
      numval[i] = F2CLOGICAL(numval[i]);
   ffgknl( fptr, keyroot, nstart, nkeys, numval, nfound, status );
   for( i=0; i<nkeys; i++ )
      numval[i] = C2FLOGICAL(numval[i]);
}